

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O1

void avlCheckNode(NodeAVL *nd,int *err)

{
  NodeAVL *pNVar1;
  
  while( true ) {
    if (nd == (NodeAVL *)0x0) {
      return;
    }
    pNVar1 = nd->left;
    if (pNVar1 != (NodeAVL *)0x0) {
      if (nd->key < pNVar1->key) {
        printf("Nespravne poradi nd=%d nd->left=%d (%6.4f %6.4f)\n",(ulong)(uint)nd->id,
               (ulong)(uint)pNVar1->id);
        *err = 1;
      }
      pNVar1 = nd->left->parent;
      if (pNVar1 != nd) {
        printf("Nespravny rodic u nd->left=%d (je %d ma byt %d)\n",(ulong)(uint)nd->left->id,
               (ulong)(uint)pNVar1->id,(ulong)(uint)nd->id);
        *err = 1;
      }
      avlCheckNode(nd->left,err);
    }
    pNVar1 = nd->right;
    if (pNVar1 == (NodeAVL *)0x0) break;
    if (pNVar1->key < nd->key) {
      printf("Nespravne poradi nd=%d nd->right=%d (%6.4f %6.4f)\n",(ulong)(uint)nd->id,
             (ulong)(uint)pNVar1->id);
      *err = 1;
    }
    pNVar1 = nd->right->parent;
    if (pNVar1 != nd) {
      printf("Nespravny rodic u nd->right=%d (je %d ma byt %d)\n",(ulong)(uint)nd->right->id,
             (ulong)(uint)pNVar1->id,(ulong)(uint)nd->id);
      *err = 1;
    }
    nd = nd->right;
  }
  return;
}

Assistant:

static
void avlCheckNode( NodeAVL *nd, int *err ){
    if ( !nd ) return;
    if ( nd->left ){
        if ( nd->left->key > nd->key ){
            printf( "Nespravne poradi nd=%d nd->left=%d (%6.4f %6.4f)\n", nd->id, nd->left->id, nd->key, nd->left->key );
            *err = 1;
        }
        if ( nd->left->parent != nd ){
            printf( "Nespravny rodic u nd->left=%d (je %d ma byt %d)\n", nd->left->id, nd->left->parent->id, nd->id );
            *err = 1; }
        avlCheckNode( nd->left, err );
    }

    if ( nd->right ){
        if ( nd->right->key < nd->key ){
            printf( "Nespravne poradi nd=%d nd->right=%d (%6.4f %6.4f)\n", nd->id, nd->right->id, nd->key, nd->right->key );
            *err = 1;
        }
        if ( nd->right->parent != nd ){
            printf( "Nespravny rodic u nd->right=%d (je %d ma byt %d)\n", nd->right->id, nd->right->parent->id, nd->id );
            *err = 1;
        }
        avlCheckNode( nd->right, err );
    }
}